

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O1

ReferenceCounterValueType __thiscall
Diligent::
DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
::Release(DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
          *this)

{
  ReferenceCounterValueType RVar1;
  char (*in_RCX) [26];
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl> pDevice;
  string msg;
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl> local_40;
  anon_class_16_2_6cb51993 local_38;
  string local_28;
  
  local_38.pDevice = &local_40;
  local_40.m_pObject = (RenderDeviceVkImpl *)0x0;
  local_38.this = this;
  if ((this->super_ObjectBase<Diligent::IShaderBindingTableVk>).
      super_RefCountedObject<Diligent::IShaderBindingTableVk>.m_pRefCounters ==
      (RefCountersImpl *)0x0) {
    FormatString<char[26],char[26]>
              (&local_28,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"Release",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x232);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  RVar1 = RefCountersImpl::
          ReleaseStrongRef<Diligent::DeviceObjectBase<Diligent::IShaderBindingTableVk,Diligent::RenderDeviceVkImpl,Diligent::ShaderBindingTableDesc>::Release()::_lambda()_1_&>
                    ((this->super_ObjectBase<Diligent::IShaderBindingTableVk>).
                     super_RefCountedObject<Diligent::IShaderBindingTableVk>.m_pRefCounters,
                     &local_38);
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::Release(&local_40);
  return RVar1;
}

Assistant:

Release() override final
    {
        // Render device owns allocators for all types of device objects,
        // so it must be destroyed after all device objects are released.
        // Consider the following scenario: an object A owns the last strong
        // reference to the device:
        //
        // 1. A::~A() completes
        // 2. A::~DeviceObjectBase() completes
        // 3. A::m_pDevice is released
        //       Render device is destroyed, all allocators are invalid
        // 4. RefCountersImpl::ObjectWrapperBase::DestroyObject() calls
        //    m_pAllocator->Free(m_pObject) - crash!

        RefCntAutoPtr<RenderDeviceImplType> pDevice;
        return TBase::Release(
            [&]() //
            {
                // We must keep the device alive while the object is being destroyed
                // Note that internal device objects do not keep strong reference to the device
                if (!m_bIsDeviceInternal)
                {
                    pDevice = m_pDevice;
                }
            });
    }